

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

void __thiscall
gimage::Image<float,_gimage::PixelTraits<float>_>::Image
          (Image<float,_gimage::PixelTraits<float>_> *this,
          Image<float,_gimage::PixelTraits<float>_> *a)

{
  Image<float,_gimage::PixelTraits<float>_> *a_local;
  Image<float,_gimage::PixelTraits<float>_> *this_local;
  
  this->depth = a->depth;
  this->width = a->width;
  this->height = a->height;
  this->n = a->n;
  this->pixel = a->pixel;
  this->row = a->row;
  this->img = a->img;
  a->depth = 0;
  a->width = 0;
  a->height = 0;
  a->n = 0;
  a->pixel = (float *)0x0;
  a->row = (float **)0x0;
  a->img = (float ***)0x0;
  return;
}

Assistant:

Image(Image<T> &&a) noexcept
    {
      depth=a.depth;
      width=a.width;
      height=a.height;
      n=a.n;
      pixel=a.pixel;
      row=a.row;
      img=a.img;

      a.depth=0;
      a.width=0;
      a.height=0;
      a.n=0;
      a.pixel=0;
      a.row=0;
      a.img=0;
    }